

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi00.hpp
# Opt level: O0

size_t __thiscall
websocketpp::processor::hybi00<websocketpp::config::asio>::consume
          (hybi00<websocketpp::config::asio> *this,uint8_t *buf,size_t len,error_code *ec)

{
  bool bVar1;
  uchar *payload;
  undefined8 *in_RCX;
  ulong in_RDX;
  long in_RSI;
  error_code *in_RDI;
  error_code eVar2;
  uint8_t *it;
  size_t l;
  size_t p;
  shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  error_category *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  error_category *in_stack_ffffffffffffffa8;
  value in_stack_ffffffffffffffb4;
  con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
  *in_stack_ffffffffffffffb8;
  undefined8 local_40;
  undefined8 local_38;
  ulong local_28;
  
  local_28 = 0;
  std::error_code::error_code(in_RDI);
  *in_RCX = local_40;
  in_RCX[1] = local_38;
  while( true ) {
    while( true ) {
      if (in_RDX <= local_28) {
        return local_28;
      }
      if (*(int *)((long)&in_RDI[1]._M_cat + 4) != 0) break;
      if (*(char *)(in_RSI + local_28) == *(char *)&in_RDI[1]._M_cat) {
        local_28 = local_28 + 1;
        std::
        __shared_ptr_access<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<websocketpp::message_buffer::alloc::con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3252b7);
        message_buffer::alloc::
        con_msg_manager<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
        ::get_message(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                      (size_t)in_stack_ffffffffffffffa8);
        std::
        shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
        ::operator=((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                     *)in_RDI,in_stack_ffffffffffffff78);
        std::
        shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
        ::~shared_ptr((shared_ptr<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>_>
                       *)0x3252eb);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 3));
        if (bVar1) {
          *(undefined4 *)((long)&in_RDI[1]._M_cat + 4) = 1;
        }
        else {
          eVar2 = websocketpp::error::make_error_code(0);
          in_stack_ffffffffffffffa8 = eVar2._M_cat;
          in_stack_ffffffffffffffa0 = eVar2._M_value;
          *in_RCX = CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
          in_RCX[1] = in_stack_ffffffffffffffa8;
          *(undefined4 *)((long)&in_RDI[1]._M_cat + 4) = 3;
        }
      }
      else {
        eVar2 = error::make_error_code(0);
        in_stack_ffffffffffffff98 = eVar2._M_cat;
        in_stack_ffffffffffffff90 = eVar2._M_value;
        *in_RCX = CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
        in_RCX[1] = in_stack_ffffffffffffff98;
        *(undefined4 *)((long)&in_RDI[1]._M_cat + 4) = 3;
      }
    }
    if (*(int *)((long)&in_RDI[1]._M_cat + 4) != 1) break;
    payload = std::find<unsigned_char*,unsigned_char>
                        ((uchar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (uchar *)in_stack_ffffffffffffff98,
                         (uchar *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_28 = (long)payload - in_RSI;
    std::
    __shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3253db);
    message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>::append_payload
              ((message<websocketpp::message_buffer::alloc::con_msg_manager> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),payload,(size_t)in_RDI)
    ;
    if (payload != (uchar *)(in_RSI + in_RDX)) {
      local_28 = local_28 + 1;
      *(undefined4 *)((long)&in_RDI[1]._M_cat + 4) = 2;
    }
  }
  return local_28;
}

Assistant:

size_t consume(uint8_t * buf, size_t len, lib::error_code & ec) {
        // if in state header we are expecting a 0x00 byte, if we don't get one
        // it is a fatal error
        size_t p = 0; // bytes processed
        size_t l = 0;

        ec = lib::error_code();

        while (p < len) {
            if (m_state == HEADER) {
                if (buf[p] == msg_hdr) {
                    p++;
                    m_msg_ptr = m_msg_manager->get_message(frame::opcode::text,1);

                    if (!m_msg_ptr) {
                        ec = make_error_code(websocketpp::error::no_incoming_buffers);
                        m_state = FATAL_ERROR;
                    } else {
                        m_state = PAYLOAD;
                    }
                } else {
                    ec = make_error_code(error::protocol_violation);
                    m_state = FATAL_ERROR;
                }
            } else if (m_state == PAYLOAD) {
                uint8_t *it = std::find(buf+p,buf+len,msg_ftr);

                // 0    1    2    3    4    5
                // 0x00 0x23 0x23 0x23 0xff 0xXX

                // Copy payload bytes into message
                l = static_cast<size_t>(it-(buf+p));
                m_msg_ptr->append_payload(buf+p,l);
                p += l;

                if (it != buf+len) {
                    // message is done, copy it and the trailing
                    p++;
                    // TODO: validation
                    m_state = READY;
                }
            } else {
                // TODO
                break;
            }
        }
        // If we get one, we create a new message and move to application state

        // if in state application we are copying bytes into the output message
        // and validating them for UTF8 until we hit a 0xff byte. Once we hit
        // 0x00, the message is complete and is dispatched. Then we go back to
        // header state.

        //ec = make_error_code(error::not_implemented);
        return p;
    }